

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O1

void __thiscall VFS::CVFS::CreateDir(CVFS *this,string *Path,bool Force)

{
  mutex *__mutex;
  bool bVar1;
  long lVar2;
  size_type sVar3;
  int iVar4;
  CVFSDir *pCVar5;
  CVFSException *pCVar6;
  long *plVar7;
  char *__s;
  CVFSDir *__tmp;
  undefined7 in_register_00000011;
  ulong uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  long lVar10;
  undefined1 auVar11 [12];
  VFSDir CurDir;
  VFSDir tmp;
  VFSNode node;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Dirs;
  string Dir;
  allocator<char> local_f9;
  CVFSDir *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  CVFSDir *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_e0 [2];
  undefined4 local_cc;
  string local_c8;
  CVFSDir *local_a8;
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  VFSNode local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_cc = (undefined4)CONCAT71(in_register_00000011,Force);
  SplitPath((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98,this,Path);
  local_f8 = (this->m_Root).super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  local_f0._M_pi =
       (this->m_Root).super___shared_ptr<VFS::CVFS::CVFSDir,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi;
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_f0._M_pi)->_M_use_count = (local_f0._M_pi)->_M_use_count + 1;
    }
  }
  if (local_98._8_8_ != local_98._0_8_) {
    lVar10 = 8;
    uVar8 = 0;
    do {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      lVar2 = *(long *)(local_98._0_8_ + lVar10 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar2,
                 *(long *)((long)&((_Alloc_hider *)local_98._0_8_)->_M_p + lVar10) + lVar2);
      CVFSDir::Search((CVFSDir *)&local_a8,(string *)local_f8);
      pCVar5 = local_a8;
      if (local_a8 == (CVFSDir *)0x0) {
        if (((char)local_cc == '\0') &&
           (uVar8 != ((long)(local_98._8_8_ - local_98._0_8_) >> 5) - 1U)) goto LAB_001085ad;
        local_e8 = (CVFSDir *)0x0;
        a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pCVar5 = (CVFSDir *)operator_new(0x80);
        CVFSDir::CVFSDir(pCVar5,&local_70);
        local_c8._M_dataplus._M_p = (pointer)pCVar5;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<VFS::CVFS::CVFSDir*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,pCVar5);
        sVar3 = local_c8._M_string_length;
        local_e8 = (CVFSDir *)local_c8._M_dataplus._M_p;
        _Var9._M_pi = a_Stack_e0[0]._M_pi;
        local_c8._M_dataplus._M_p = (pointer)0x0;
        local_c8._M_string_length = 0;
        a_Stack_e0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
        if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
        }
        local_80.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_e8->super_CVFSNode;
        local_80.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             a_Stack_e0[0]._M_pi;
        if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (a_Stack_e0[0]._M_pi)->_M_use_count = (a_Stack_e0[0]._M_pi)->_M_use_count + 1;
          }
        }
        CVFSDir::AppendChild(local_f8,&local_80);
        if (local_80.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_80.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_f8 = local_e8;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_f0,a_Stack_e0);
        _Var9._M_pi = a_Stack_e0[0]._M_pi;
      }
      else {
        __mutex = &(local_a8->super_CVFSNode).m_UpdateLock;
        iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (iVar4 != 0) {
          auVar11 = std::__throw_system_error(iVar4);
          operator_delete(__mutex,0x80);
          if (auVar11._8_4_ == 1) {
            plVar7 = (long *)__cxa_begin_catch(auVar11._0_8_);
            pCVar6 = (CVFSException *)__cxa_allocate_exception(0x30);
            __s = (char *)(**(code **)(*plVar7 + 0x10))(plVar7);
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_f9);
            std::operator+(&local_c8,"Can\'t create directory. Out of mem. bad_alloc: ",&local_50);
            CVFSException::CVFSException(pCVar6,&local_c8,OUT_OF_MEM);
            __cxa_throw(pCVar6,&CVFSException::typeinfo,CVFSException::~CVFSException);
          }
          if (a_Stack_e0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_e0[0]._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_98);
          _Unwind_Resume(auVar11._0_8_);
        }
        bVar1 = (pCVar5->super_CVFSNode).m_IsDir;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        _Var9._M_pi = local_f0._M_pi;
        if (bVar1 == false) {
LAB_001085ad:
          pCVar6 = (CVFSException *)__cxa_allocate_exception(0x30);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"Can\'t create directory","");
          CVFSException::CVFSException(pCVar6,&local_c8,CANT_CREATE_DIR);
          __cxa_throw(pCVar6,&CVFSException::typeinfo,CVFSException::~CVFSException);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_a0._M_p + 8) = *(int *)(local_a0._M_p + 8) + 1;
          }
        }
        local_f8 = local_a8;
        local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p;
      }
      if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x20;
    } while (uVar8 < (ulong)((long)(local_98._8_8_ - local_98._0_8_) >> 5));
  }
  if (local_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  return;
}

Assistant:

void CreateDir(const std::string &Path, bool Force = false)
            {
                auto Dirs = SplitPath(Path);
                auto CurDir = m_Root;

                for (size_t i = 0; i < Dirs.size(); i++)
                {
                    std::string Dir = Dirs[i];

                    auto node = CurDir->Search(Dir);

                    //Creates the directory either if Force is true or we are at the end of the path.
                    if(!node && (Force || (i == Dirs.size() - 1)))
                    {
                        VFSDir tmp;
                        try
                        {
                            tmp = VFSDir(new CVFSDir(Dir));
                            CurDir->AppendChild(tmp);
                        }
                        catch(const std::bad_alloc &e)
                        {
                            throw CVFSException("Can't create directory. Out of mem. bad_alloc: " + std::string(e.what()), VFSError::OUT_OF_MEM);
                        }
                        
                        CurDir = tmp;
                    }
                    else if(!node || !node->IsDir())
                        throw CVFSException("Can't create directory", VFSError::CANT_CREATE_DIR);
                    else
                        CurDir = std::static_pointer_cast<CVFSDir>(node);
                }               
            }